

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINConstraint(KINMem kin_mem)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  undefined4 local_4;
  
  N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0x138),
               *(undefined8 *)(in_RDI + 0x148));
  iVar1 = N_VConstrMask(*(undefined8 *)(in_RDI + 0x140),*(undefined8 *)(in_RDI + 0x148),
                        *(undefined8 *)(in_RDI + 0x150));
  if (iVar1 == 0) {
    N_VAbs(*(undefined8 *)(in_RDI + 0x138),*(undefined8 *)(in_RDI + 0x148));
    N_VProd(*(undefined8 *)(in_RDI + 0x150),*(undefined8 *)(in_RDI + 0x148),
            *(undefined8 *)(in_RDI + 0x148));
    N_VAbs(*(undefined8 *)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0x150));
    dVar2 = (double)N_VMinQuotient(*(undefined8 *)(in_RDI + 0x150),*(undefined8 *)(in_RDI + 0x148));
    *(double *)(in_RDI + 0x98) = dVar2 * 0.9;
    local_4 = -0x3e4;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int KINConstraint(KINMem kin_mem)
{
  N_VLinearSum(ONE, kin_mem->kin_uu, ONE, kin_mem->kin_pp, kin_mem->kin_vtemp1);

  /* if vtemp1[i] violates constraint[i] then vtemp2[i] = 1
     else vtemp2[i] = 0 (vtemp2 is the mask vector) */

  if (N_VConstrMask(kin_mem->kin_constraints, kin_mem->kin_vtemp1,
                    kin_mem->kin_vtemp2))
  {
    return (KIN_SUCCESS);
  }

  /* vtemp1[i] = SUNRabs(pp[i]) */

  N_VAbs(kin_mem->kin_pp, kin_mem->kin_vtemp1);

  /* consider vtemp1[i] only if vtemp2[i] = 1 (constraint violated) */

  N_VProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp1, kin_mem->kin_vtemp1);

  N_VAbs(kin_mem->kin_uu, kin_mem->kin_vtemp2);
  kin_mem->kin_stepmul = POINT9 * N_VMinQuotient(kin_mem->kin_vtemp2,
                                                 kin_mem->kin_vtemp1);

  return (CONSTR_VIOLATED);
}